

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall TestOutput::printFileAndLineForTestAndFailure(TestOutput *this,TestFailure *failure)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  TestFailure *local_18;
  TestFailure *failure_local;
  TestOutput *this_local;
  
  local_18 = failure;
  failure_local = (TestFailure *)this;
  (*failure->_vptr_TestFailure[7])(&local_28);
  iVar1 = (*local_18->_vptr_TestFailure[8])();
  printErrorInFileOnLineFormattedForWorkingEnvironment(this,&local_28,CONCAT44(extraout_var,iVar1));
  SimpleString::~SimpleString(&local_28);
  (*local_18->_vptr_TestFailure[3])();
  printFailureInTest(this,local_48);
  SimpleString::~SimpleString(local_48);
  (*local_18->_vptr_TestFailure[2])(&local_58);
  iVar1 = (*local_18->_vptr_TestFailure[5])();
  printErrorInFileOnLineFormattedForWorkingEnvironment
            (this,&local_58,CONCAT44(extraout_var_00,iVar1));
  SimpleString::~SimpleString(&local_58);
  return;
}

Assistant:

void TestOutput::printFileAndLineForTestAndFailure(const TestFailure& failure)
{
    printErrorInFileOnLineFormattedForWorkingEnvironment(failure.getTestFileName(), failure.getTestLineNumber());
    printFailureInTest(failure.getTestName());
    printErrorInFileOnLineFormattedForWorkingEnvironment(failure.getFileName(), failure.getFailureLineNumber());
}